

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::changeObj(SPxLPBase<double> *this,VectorBase<double> *newObj,bool scale)

{
  int local_c;
  
  (*(this->super_LPRowSetBase<double>).super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x26])();
  if (this->thesense == MINIMIZE) {
    local_c = -1;
    VectorBase<double>::operator*=(&(this->super_LPColSetBase<double>).object,&local_c);
  }
  return;
}

Assistant:

virtual void changeObj(const VectorBase<R>& newObj, bool scale = false)
   {
      changeMaxObj(newObj, scale);

      if(spxSense() == MINIMIZE)
         LPColSetBase<R>::maxObj_w() *= -1;
   }